

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O1

uint __thiscall wallet::CWallet::GetKeyPoolSize(CWallet *this)

{
  int iVar1;
  uint uVar2;
  long in_FS_OFFSET;
  _Rb_tree<wallet::ScriptPubKeyMan_*,_wallet::ScriptPubKeyMan_*,_std::_Identity<wallet::ScriptPubKeyMan_*>,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
  local_50;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  GetActiveScriptPubKeyMans
            ((set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
              *)&local_50,this);
  uVar2 = 0;
  for (; (_Rb_tree_header *)local_50._M_impl.super__Rb_tree_header._M_header._M_left !=
         &local_50._M_impl.super__Rb_tree_header;
      local_50._M_impl.super__Rb_tree_header._M_header._M_left =
           (_Base_ptr)
           std::_Rb_tree_increment
                     ((_Rb_tree_node_base *)local_50._M_impl.super__Rb_tree_header._M_header._M_left
                     )) {
    iVar1 = (**(code **)(**(long **)(local_50._M_impl.super__Rb_tree_header._M_header._M_left + 1) +
                        0x90))();
    uVar2 = uVar2 + iVar1;
  }
  std::
  _Rb_tree<wallet::ScriptPubKeyMan_*,_wallet::ScriptPubKeyMan_*,_std::_Identity<wallet::ScriptPubKeyMan_*>,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
  ::~_Rb_tree(&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return uVar2;
}

Assistant:

unsigned int CWallet::GetKeyPoolSize() const
{
    AssertLockHeld(cs_wallet);

    unsigned int count = 0;
    for (auto spk_man : GetActiveScriptPubKeyMans()) {
        count += spk_man->GetKeyPoolSize();
    }
    return count;
}